

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcBeamType::IfcBeamType(IfcBeamType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_007261d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcBeamType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__007d9578);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7d9448;
  *(undefined8 *)&this->field_0x1c0 = 0x7d9560;
  *(undefined8 *)&this->field_0x88 = 0x7d9470;
  *(undefined8 *)&this->field_0x98 = 0x7d9498;
  *(undefined8 *)&this->field_0xf0 = 0x7d94c0;
  *(undefined8 *)&this->field_0x148 = 0x7d94e8;
  *(undefined8 *)&this->field_0x180 = 0x7d9510;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x7d9538;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).field_0x18 =
       0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcBeamType() : Object("IfcBeamType") {}